

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

yyjson_mut_val *
duckdb_yyjson::unsafe_yyjson_mut_ptr_replacex
          (yyjson_mut_val *val,char *ptr,size_t len,yyjson_mut_val *new_val,yyjson_ptr_ctx *ctx,
          yyjson_ptr_err *err)

{
  yyjson_mut_val *pyVar1;
  yyjson_mut_val *pyVar2;
  int iVar3;
  yyjson_mut_val *pyVar4;
  yyjson_mut_val *pyVar5;
  yyjson_mut_val *pyVar6;
  bool bVar7;
  ulong __n;
  yyjson_ptr_ctx *pyVar8;
  ulong uVar9;
  yyjson_ptr_ctx *pyVar10;
  yyjson_mut_val *pyVar11;
  ulong uVar12;
  ulong uVar13;
  yyjson_ptr_ctx cur_ctx;
  yyjson_mut_val *local_88;
  yyjson_ptr_ctx local_48;
  
  local_48.ctn = (yyjson_mut_val *)0x0;
  local_48.pre = (yyjson_mut_val *)0x0;
  local_48.old = (yyjson_mut_val *)0x0;
  pyVar10 = ctx;
  if (ctx == (yyjson_ptr_ctx *)0x0) {
    pyVar10 = &local_48;
  }
  pyVar4 = unsafe_yyjson_mut_ptr_getx(val,ptr,len,pyVar10,err);
  if (pyVar4 == (yyjson_mut_val *)0x0) {
    return (yyjson_mut_val *)0x0;
  }
  pyVar10 = (yyjson_ptr_ctx *)pyVar10->ctn;
  if (pyVar10 != (yyjson_ptr_ctx *)0x0) {
    local_88 = pyVar10->ctn;
    pyVar8 = ctx;
    if (ctx == (yyjson_ptr_ctx *)0x0) {
      pyVar8 = &local_48;
    }
    pyVar1 = pyVar8->pre;
    if ((~(uint)local_88 & 7) == 0) {
      pyVar1 = pyVar1->next->next;
      if ((pyVar1 != (yyjson_mut_val *)0x0) && (((uint)pyVar1->tag & 7) == 5)) {
        if (local_88 < (yyjson_mut_val *)0x100) {
          uVar9 = 0;
          bVar7 = false;
        }
        else {
          __n = pyVar1->tag >> 8;
          uVar9 = (ulong)local_88 >> 8;
          bVar7 = false;
          pyVar5 = pyVar10->pre;
          uVar12 = 0;
          do {
            pyVar11 = pyVar5->next;
            pyVar6 = pyVar11->next;
            if (pyVar6 == (yyjson_mut_val *)0x0) break;
            uVar13 = uVar12 + 1;
            if ((pyVar6->tag >> 8 == __n) &&
               (iVar3 = bcmp((pyVar6->uni).ptr,(pyVar1->uni).ptr,__n), iVar3 == 0)) {
              pyVar2 = pyVar6->next->next;
              if (new_val == (yyjson_mut_val *)0x0 || bVar7) {
                if (uVar13 == uVar9) {
                  pyVar10->pre = pyVar5;
                  pyVar11 = pyVar5->next;
                }
                uVar9 = uVar9 - 1;
                local_88 = (yyjson_mut_val *)(uVar9 * 0x100 | (ulong)local_88 & 0xff);
                pyVar10->ctn = local_88;
                pyVar11->next = pyVar2;
                pyVar6 = pyVar5;
                uVar13 = uVar12;
              }
              else {
                new_val->next = pyVar2;
                pyVar6->next = new_val;
                bVar7 = true;
              }
            }
            pyVar5 = pyVar6;
            uVar12 = uVar13;
          } while (uVar13 < uVar9);
        }
        if (new_val != (yyjson_mut_val *)0x0 && !bVar7) {
          pyVar5 = pyVar1;
          if (uVar9 != 0) {
            pyVar11 = pyVar10->pre->next;
            pyVar5 = pyVar11->next;
            pyVar11->next = pyVar1;
          }
          new_val->next = pyVar5;
          pyVar1->next = new_val;
          pyVar10->pre = pyVar1;
          pyVar10->ctn = (yyjson_mut_val *)(((ulong)local_88 & 0xff) + uVar9 * 0x100 + 0x100);
        }
      }
    }
    else if (new_val != (yyjson_mut_val *)0x0 && pyVar1 != (yyjson_mut_val *)0x0) {
      pyVar5 = pyVar1->next;
      if (pyVar1 == pyVar5) {
        new_val->next = new_val;
        pyVar10->pre = new_val;
        pyVar10 = pyVar8;
      }
      else {
        new_val->next = pyVar5->next;
        pyVar1->next = new_val;
        if (pyVar10->pre != pyVar5) goto LAB_01cf9203;
      }
      pyVar10->pre = new_val;
    }
  }
LAB_01cf9203:
  pyVar10 = &local_48;
  if (ctx != (yyjson_ptr_ctx *)0x0) {
    pyVar10 = ctx;
  }
  pyVar10->old = pyVar4;
  return pyVar4;
}

Assistant:

yyjson_mut_val *unsafe_yyjson_mut_ptr_replacex(
    yyjson_mut_val *val, const char *ptr, size_t len, yyjson_mut_val *new_val,
    yyjson_ptr_ctx *ctx, yyjson_ptr_err *err) {

    yyjson_mut_val *cur_val;
    yyjson_ptr_ctx cur_ctx;
    memset(&cur_ctx, 0, sizeof(cur_ctx));
    if (!ctx) ctx = &cur_ctx;
    cur_val = unsafe_yyjson_mut_ptr_getx(val, ptr, len, ctx, err);
    if (!cur_val) return NULL;

    if (yyjson_mut_is_obj(ctx->ctn)) {
        yyjson_mut_val *key = ctx->pre->next->next;
        yyjson_mut_obj_put(ctx->ctn, key, new_val);
    } else {
        yyjson_ptr_ctx_replace(ctx, new_val);
    }
    ctx->old = cur_val;
    return cur_val;
}